

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn4.hpp
# Opt level: O2

void __thiscall trng::yarn4::jump2(yarn4 *this,uint s)

{
  uint uVar1;
  int32_t (*a) [16];
  result_type d [4];
  int32_t local_b8 [2];
  int32_t aiStack_b0 [2];
  result_type c [16];
  int32_t local_68 [2];
  int32_t aiStack_60 [2];
  int32_t local_58;
  int32_t local_54 [5];
  int32_t local_40 [6];
  
  c[0xc] = 0;
  c[0xd] = 0;
  c[0xe] = 0;
  c[0xf] = 0;
  c[8] = 0;
  c[9] = 0;
  c[10] = 0;
  c[0xb] = 0;
  c[4] = 0;
  c[5] = 0;
  c[6] = 0;
  c[7] = 0;
  c[0] = 0;
  c[1] = 0;
  c[2] = 0;
  c[3] = 0;
  local_68 = *(int32_t (*) [2])(this->P).a;
  aiStack_60 = *(int32_t (*) [2])((this->P).a + 2);
  local_58 = 1;
  local_54[0] = 0;
  local_54[1] = 0;
  local_54[2] = 0;
  local_54[3] = 0;
  local_40[0] = 0;
  local_40[1] = 0;
  local_40[2] = 0;
  local_40[3] = 0;
  local_40[4] = 1;
  local_40[5] = 0;
  local_54[4] = local_58;
  for (uVar1 = 0; uVar1 < s; uVar1 = uVar1 + 2) {
    int_math::matrix_mult<4>((int32_t (*) [16])local_68,(int32_t (*) [16])local_68,&c,0x7fffffff);
    if (s <= uVar1 + 1) break;
    int_math::matrix_mult<4>(&c,&c,(int32_t (*) [16])local_68,0x7fffffff);
  }
  local_b8 = *(int32_t (*) [2])(this->S).r;
  aiStack_b0 = *(int32_t (*) [2])((this->S).r + 2);
  a = &c;
  if ((s & 1) == 0) {
    a = (int32_t (*) [16])local_68;
  }
  int_math::matrix_vec_mult<4>(a,(int32_t (*) [4])local_b8,&d,0x7fffffff);
  *(undefined8 *)(this->S).r = d._0_8_;
  *(undefined8 *)((this->S).r + 2) = d._8_8_;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn4::jump2(unsigned int s) {
    result_type b[16], c[16]{};
    b[0] = P.a[0];
    b[1] = P.a[1];
    b[2] = P.a[2];
    b[3] = P.a[3];
    b[4] = 1;
    b[5] = 0;
    b[6] = 0;
    b[7] = 0;
    b[8] = 0;
    b[9] = 1;
    b[10] = 0;
    b[11] = 0;
    b[12] = 0;
    b[13] = 0;
    b[14] = 1;
    b[15] = 0;
    for (unsigned int i{0}; i < s; ++i) {
      int_math::matrix_mult<4>(b, b, c, modulus);
      ++i;
      if (not(i < s))
        break;
      int_math::matrix_mult<4>(c, c, b, modulus);
    }
    const result_type r[4]{S.r[0], S.r[1], S.r[2], S.r[3]};
    result_type d[4];
    if ((s & 1u) == 0)
      int_math::matrix_vec_mult<4>(b, r, d, modulus);
    else
      int_math::matrix_vec_mult<4>(c, r, d, modulus);
    S.r[0] = d[0];
    S.r[1] = d[1];
    S.r[2] = d[2];
    S.r[3] = d[3];
  }